

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O3

void scrolling_group_invalid_proc
               (Am_Object *group,Am_Object *which_part,int left,int top,int width,int height)

{
  bool bVar1;
  int my_width;
  int my_height;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Wrapper *pAVar6;
  Am_Value *pAVar7;
  Am_Slot_Key key;
  int local_80;
  int local_7c;
  int final_height;
  int final_width;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object v_scroller;
  Am_Object h_scroller;
  Am_Object owner;
  int final_top;
  int final_left;
  
  key = (Am_Slot_Key)group;
  Am_Object::Get_Object(&owner,key,10);
  pAVar6 = Am_Object::operator_cast_to_Am_Wrapper_(&owner);
  if (pAVar6 != (Am_Wrapper *)0x0) {
    pAVar7 = Am_Object::Get(group,100,7);
    local_7c = Am_Value::operator_cast_to_int(pAVar7);
    pAVar7 = Am_Object::Get(group,0x65,7);
    local_80 = Am_Value::operator_cast_to_int(pAVar7);
    pAVar7 = Am_Object::Get(group,0x66,7);
    my_width = Am_Value::operator_cast_to_int(pAVar7);
    pAVar7 = Am_Object::Get(group,0x67,7);
    my_height = Am_Value::operator_cast_to_int(pAVar7);
    Am_Object::Get_Object(&h_scroller,key,0x1c3);
    Am_Object::Get_Object(&v_scroller,key,0x1c4);
    bVar1 = Am_Object::operator!=(which_part,&h_scroller);
    if (bVar1) {
      bVar1 = Am_Object::operator!=(which_part,&v_scroller);
      if (bVar1) {
        pAVar7 = Am_Object::Get(group,0x1bf,7);
        iVar2 = Am_Value::operator_cast_to_int(pAVar7);
        pAVar7 = Am_Object::Get(group,0x1c0,7);
        iVar3 = Am_Value::operator_cast_to_int(pAVar7);
        pAVar7 = Am_Object::Get(group,0x1c1,7);
        my_width = Am_Value::operator_cast_to_int(pAVar7);
        pAVar7 = Am_Object::Get(group,0x1c2,7);
        my_height = Am_Value::operator_cast_to_int(pAVar7);
        pAVar7 = Am_Object::Get(group,0x11d,7);
        iVar4 = Am_Value::operator_cast_to_int(pAVar7);
        pAVar7 = Am_Object::Get(group,0x11e,7);
        iVar5 = Am_Value::operator_cast_to_int(pAVar7);
        local_7c = local_7c + iVar2;
        local_80 = local_80 + iVar3;
        left = left - iVar4;
        top = top - iVar5;
      }
    }
    Am_Invalid_Rectangle_Intersect
              (left,top,width,height,local_7c,local_80,my_width,my_height,&final_left,&final_top,
               &final_width,&final_height);
    if ((0 < final_width) && (0 < final_height)) {
      Am_Object::Am_Object(&local_68,&owner);
      Am_Object::Am_Object(&local_70,group);
      Am_Invalidate(&local_68,&local_70,final_left,final_top,final_width,final_height);
      Am_Object::~Am_Object(&local_70);
      Am_Object::~Am_Object(&local_68);
    }
    Am_Object::~Am_Object(&v_scroller);
    Am_Object::~Am_Object(&h_scroller);
  }
  Am_Object::~Am_Object(&owner);
  return;
}

Assistant:

Am_Define_Method(Am_Invalid_Method, void, scrolling_group_invalid,
                 (Am_Object group, Am_Object which_part, int left, int top,
                  int width, int height))
{
  Am_Object owner = group.Get_Owner(Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
  if (owner) {
    int my_left =
        group.Get(Am_LEFT, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
    int my_top = group.Get(Am_TOP, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
    int my_width =
        group.Get(Am_WIDTH, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
    int my_height =
        group.Get(Am_HEIGHT, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
    int final_left, final_top, final_width, final_height;
    Am_Object h_scroller = group.Get_Object(
        Am_H_SCROLLER, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
    Am_Object v_scroller = group.Get_Object(
        Am_V_SCROLLER, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
    // check if one of the scroll bars
    if (which_part != h_scroller && which_part != v_scroller) {
      // then transform based on offsets for the inside

      // adjust both the clip region and the object to be in my
      // parent's coordinate system
      int insideleft =
          group.Get(Am_CLIP_LEFT, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
      int insidetop =
          group.Get(Am_CLIP_TOP, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
      my_width = group.Get(
          Am_CLIP_WIDTH,
          Am_NO_DEPENDENCY |
              Am_RETURN_ZERO_ON_ERROR); //just re-set the value directly
      my_height =
          group.Get(Am_CLIP_HEIGHT, Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);

      my_left += insideleft;
      my_top += insidetop;

      //now offset the area by the x and y offsets
      left -= (int)group.Get(Am_X_OFFSET,
                             Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
      top -= (int)group.Get(Am_Y_OFFSET,
                            Am_NO_DEPENDENCY | Am_RETURN_ZERO_ON_ERROR);
    } // done with inside scrolling part

    // now clip incoming rectangle to my rectangle
    Am_Invalid_Rectangle_Intersect(left, top, width, height, my_left, my_top,
                                   my_width, my_height, final_left, final_top,
                                   final_width, final_height);
    if ((final_width > 0) && (final_height > 0))
      Am_Invalidate(owner, group, final_left, final_top, final_width,
                    final_height);
  }
}